

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Parser::parsePoint(Parser *this,QString *data,qsizetype offset)

{
  long from;
  Data *pDVar1;
  char16_t *pcVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong from_00;
  ulong uVar6;
  qsizetype qVar7;
  QString *str;
  QString *str_00;
  QString *str_01;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_c0;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_88;
  Point local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = QString::indexOf(data,(QChar)0x28,offset,CaseSensitive);
  uVar5 = QString::indexOf(data,(QChar)0x2c,uVar4,CaseSensitive);
  local_68.parameters.d.ptr = (char16_t *)0x0;
  local_68.parameters.d.size = 0;
  local_68.name.d.size = 0;
  local_68.parameters.d.d = (Data *)0x0;
  local_68.name.d.d = (Data *)0x0;
  local_68.name.d.ptr = (char16_t *)0x0;
  local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::mid((QString *)&local_a8,data,uVar4 + 1,~uVar4 + uVar5);
  QString::simplified_helper((QString *)&local_88,(QString *)&local_a8,str);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  bVar3 = operator!=((QString *)&local_88,&this->m_provider);
  if (!bVar3) {
    from = uVar5 + 1;
    from_00 = QString::indexOf(data,(QChar)0x2c,from,CaseSensitive);
    uVar6 = QString::indexOf(data,(QChar)0x29,from,CaseSensitive);
    uVar4 = uVar6;
    if (from_00 != 0xffffffffffffffff && (long)from_00 <= (long)uVar6) {
      uVar4 = from_00;
    }
    QString::mid((QString *)&local_c0,data,from,~uVar5 + uVar4);
    QString::simplified_helper((QString *)&local_a8,(QString *)&local_c0,str_00);
    qVar7 = local_68.name.d.size;
    pcVar2 = local_68.name.d.ptr;
    pDVar1 = local_68.name.d.d;
    local_68.name.d.d = local_a8.d;
    local_68.name.d.ptr = local_a8.ptr;
    local_a8.d = pDVar1;
    local_a8.ptr = pcVar2;
    local_68.name.d.size = local_a8.size;
    local_a8.size = qVar7;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
    if (from_00 != 0xffffffffffffffff && (long)from_00 <= (long)uVar6) {
      qVar7 = QString::indexOf(data,(QChar)0x29,from_00,CaseSensitive);
      QString::mid((QString *)&local_c0,data,from_00 + 1,~from_00 + (long)(int)qVar7);
      QString::simplified_helper((QString *)&local_a8,(QString *)&local_c0,str_01);
      qVar7 = local_68.parameters.d.size;
      pcVar2 = local_68.parameters.d.ptr;
      pDVar1 = local_68.parameters.d.d;
      local_68.parameters.d.d = local_a8.d;
      local_68.parameters.d.ptr = local_a8.ptr;
      local_a8.d = pDVar1;
      local_a8.ptr = pcVar2;
      local_68.parameters.d.size = local_a8.size;
      local_a8.size = qVar7;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
    }
    QList<Point>::emplaceBack<Point_const&>(&this->m_points,&local_68);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  Point::~Point(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Parser::parsePoint(const QString &data, qsizetype offset)
{
    qsizetype beginOfProvider = data.indexOf(QLatin1Char('('), offset);
    qsizetype endOfProvider = data.indexOf(QLatin1Char(','), beginOfProvider);
    Point point;
    QString provider = data.mid(beginOfProvider + 1, endOfProvider - beginOfProvider - 1).simplified();
    if (provider != m_provider)
        return;

    qsizetype endOfPoint = data.indexOf(QLatin1Char(','), endOfProvider + 1);
    qsizetype endOfPoint2 = data.indexOf(QLatin1Char(')'), endOfProvider + 1);
    bool params = true;
    if (endOfPoint == -1 || endOfPoint2 < endOfPoint) {
        endOfPoint = endOfPoint2;
        params = false;
    }
    point.name = data.mid(endOfProvider + 1, endOfPoint - endOfProvider - 1).simplified();
    if (params) {
        int endOfParams = data.indexOf(QLatin1Char(')'), endOfPoint);
        point.parameters = data.mid(endOfPoint + 1, endOfParams - endOfPoint - 1).simplified();
    }

    DEBUGPRINTF(printf("tracepointgen: %s(%s)\n", qPrintable(point.name), qPrintable(point.parameters)));

    m_points.push_back(point);
}